

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall t_rs_generator::init_generator(t_rs_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  string f_gen_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  iVar1 = mkdir((this->gen_dir_)._M_dataplus._M_p,0x1ff);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&bStack_a8,(this->gen_dir_)._M_dataplus._M_p,(allocator *)&local_68);
      std::operator+(&f_gen_name,&bStack_a8,": ");
      __rhs = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&f_gen_name,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::operator+(&local_68,&this->gen_dir_,"/");
  rust_snake_case(&local_48,this,&((this->super_t_generator).program_)->name_);
  std::operator+(&bStack_a8,&local_68,&local_48);
  std::operator+(&f_gen_name,&bStack_a8,".rs");
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string
            ((string *)&bStack_a8,f_gen_name._M_dataplus._M_p,(allocator *)&local_68);
  this_00 = &this->f_gen_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&bStack_a8,__oflag);
  std::__cxx11::string::~string((string *)&bStack_a8);
  poVar3 = std::operator<<((ostream *)this_00,"// ");
  (*(this->super_t_generator)._vptr_t_generator[0x1d])(&bStack_a8,this);
  poVar3 = std::operator<<(poVar3,(string *)&bStack_a8);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_a8);
  poVar3 = std::operator<<((ostream *)this_00,
                           "// DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  render_attributes_and_includes(this);
  std::__cxx11::string::~string((string *)&f_gen_name);
  return;
}

Assistant:

void t_rs_generator::init_generator() {
  // make output directory for this thrift program
  MKDIR(gen_dir_.c_str());

  // create the file into which we're going to write the generated code
  string f_gen_name = gen_dir_ + "/" + rust_snake_case(get_program()->get_name()) + ".rs";
  f_gen_.open(f_gen_name.c_str());

  // header comment
  f_gen_ << "// " << autogen_summary() << endl;
  f_gen_ << "// DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING" << endl;
  f_gen_ << endl;

  render_attributes_and_includes();
}